

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_adj.cpp
# Opt level: O1

Bytes __thiscall Omega_h::filter_parents(Omega_h *this,Parents *c2p,Int parent_dim)

{
  size_type *psVar1;
  int *piVar2;
  void *pvVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  long *plVar6;
  undefined8 *puVar7;
  Alloc **__dest;
  long lVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  ulong *puVar10;
  void *extraout_RDX;
  int iVar11;
  ulong uVar12;
  Alloc *pAVar13;
  ulong uVar14;
  size_t sVar15;
  Bytes BVar16;
  ScopedTimer omega_h_scoped_function_timer;
  ScopedTimer omega_h_scoped_function_timer_1;
  string __str;
  Write<signed_char> filter;
  type f;
  size_type __dnew;
  ScopedTimer local_132;
  ScopedTimer local_131;
  string local_130;
  uint local_110;
  Alloc *local_108;
  void *local_100;
  Alloc **local_f8;
  Alloc *local_f0;
  Alloc *local_e8 [2];
  ulong *local_d8;
  long local_d0;
  ulong local_c8;
  long lStack_c0;
  Write<signed_char> local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_a0;
  void *local_98;
  Alloc *local_90;
  void *pvStack_88;
  uint local_80;
  Alloc *local_78;
  void *pvStack_70;
  Alloc *local_68;
  long local_60;
  ulong local_58;
  undefined1 local_48 [24];
  
  local_d8 = &local_c8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_d8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_adj.cpp"
             ,"");
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_d8);
  paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 == paVar9) {
    local_90 = (Alloc *)paVar9->_M_allocated_capacity;
    pvStack_88 = (void *)plVar6[3];
    local_a0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)&local_90;
  }
  else {
    local_90 = (Alloc *)paVar9->_M_allocated_capacity;
    local_a0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*plVar6;
  }
  local_98 = (void *)plVar6[1];
  *plVar6 = (long)paVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  local_f8 = local_e8;
  std::__cxx11::string::_M_construct((ulong)&local_f8,'\x03');
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_f8,3,0x10a);
  pAVar13 = (Alloc *)0xf;
  if (local_a0 !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)&local_90) {
    pAVar13 = local_90;
  }
  if (pAVar13 < (Alloc *)((long)local_f0 + (long)local_98)) {
    pAVar13 = (Alloc *)0xf;
    if (local_f8 != local_e8) {
      pAVar13 = local_e8[0];
    }
    if (pAVar13 < (Alloc *)((long)local_f0 + (long)local_98)) goto LAB_001cc9d1;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_f8,0,(char *)0x0,(ulong)local_a0);
  }
  else {
LAB_001cc9d1:
    puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_a0,(ulong)local_f8);
  }
  local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  psVar1 = puVar7 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1) {
    local_130.field_2._M_allocated_capacity = *psVar1;
    local_130.field_2._8_8_ = puVar7[3];
  }
  else {
    local_130.field_2._M_allocated_capacity = *psVar1;
    local_130._M_dataplus._M_p = (pointer)*puVar7;
  }
  local_130._M_string_length = puVar7[1];
  *puVar7 = psVar1;
  puVar7[1] = 0;
  *(undefined1 *)psVar1 = 0;
  begin_code("filter_parents",local_130._M_dataplus._M_p);
  paVar9 = &local_130.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != paVar9) {
    operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
  }
  if (local_f8 != local_e8) {
    operator_delete(local_f8,(ulong)((long)&local_e8[0]->size + 1));
  }
  if (local_a0 !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)&local_90) {
    operator_delete(local_a0,(ulong)((long)&local_90->size + 1));
  }
  if (local_d8 != &local_c8) {
    operator_delete(local_d8,local_c8 + 1);
  }
  pAVar13 = (c2p->parent_idx).write_.shared_alloc_.alloc;
  if (((ulong)pAVar13 & 1) == 0) {
    sVar15 = pAVar13->size;
  }
  else {
    sVar15 = (ulong)pAVar13 >> 3;
  }
  local_130._M_dataplus._M_p = (pointer)paVar9;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"");
  Write<signed_char>::Write(&local_b8,(LO)(sVar15 >> 2),&local_130);
  local_48._16_8_ = this;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != paVar9) {
    operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
  }
  pAVar13 = (c2p->parent_idx).write_.shared_alloc_.alloc;
  local_a0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)pAVar13;
  if (((ulong)pAVar13 & 7) == 0 && pAVar13 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_a0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)&pAVar13->size)->_M_allocated_capacity * 8 + 1);
    }
    else {
      pAVar13->use_count = pAVar13->use_count + 1;
    }
  }
  local_98 = (c2p->parent_idx).write_.shared_alloc_.direct_ptr;
  local_90 = (c2p->codes).write_.shared_alloc_.alloc;
  if (((ulong)local_90 & 7) == 0 && local_90 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_90 = (Alloc *)(local_90->size * 8 + 1);
    }
    else {
      local_90->use_count = local_90->use_count + 1;
    }
  }
  pvStack_88 = (c2p->codes).write_.shared_alloc_.direct_ptr;
  local_78 = local_b8.shared_alloc_.alloc;
  if (((ulong)local_b8.shared_alloc_.alloc & 7) == 0 && local_b8.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    if (entering_parallel == '\x01') {
      local_78 = (Alloc *)((local_b8.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_b8.shared_alloc_.alloc)->use_count = (local_b8.shared_alloc_.alloc)->use_count + 1;
    }
  }
  pvStack_70 = local_b8.shared_alloc_.direct_ptr;
  if (((ulong)pAVar13 & 1) == 0) {
    uVar12 = ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)&pAVar13->size)->_M_allocated_capacity;
  }
  else {
    uVar12 = (ulong)pAVar13 >> 3;
  }
  local_f8 = local_e8;
  local_68 = (Alloc *)0x5d;
  local_80 = parent_dim;
  __dest = (Alloc **)std::__cxx11::string::_M_create((ulong *)&local_f8,(ulong)&local_68);
  pAVar13 = local_68;
  local_e8[0] = local_68;
  local_f8 = __dest;
  memcpy(__dest,
         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_for.hpp"
         ,0x5d);
  local_f0 = pAVar13;
  *(undefined1 *)((long)__dest + (long)pAVar13) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_f8);
  puVar10 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar10) {
    local_c8 = *puVar10;
    lStack_c0 = plVar6[3];
    local_d8 = &local_c8;
  }
  else {
    local_c8 = *puVar10;
    local_d8 = (ulong *)*plVar6;
  }
  local_d0 = plVar6[1];
  *plVar6 = (long)puVar10;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  local_68 = (Alloc *)&local_58;
  std::__cxx11::string::_M_construct((ulong)&local_68,'\x02');
  *(undefined2 *)&local_68->size = 0x3438;
  uVar14 = 0xf;
  if (local_d8 != &local_c8) {
    uVar14 = local_c8;
  }
  if (uVar14 < (ulong)(local_60 + local_d0)) {
    uVar14 = 0xf;
    if (local_68 != (Alloc *)&local_58) {
      uVar14 = local_58;
    }
    if ((ulong)(local_60 + local_d0) <= uVar14) {
      plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_68,0,(char *)0x0,(ulong)local_d8)
      ;
      goto LAB_001ccd59;
    }
  }
  plVar6 = (long *)std::__cxx11::string::_M_append((char *)&local_d8,(ulong)local_68);
LAB_001ccd59:
  pAVar13 = (Alloc *)(plVar6 + 2);
  if ((Alloc *)*plVar6 == pAVar13) {
    local_130.field_2._M_allocated_capacity = pAVar13->size;
    local_130.field_2._8_8_ = plVar6[3];
    local_130._M_dataplus._M_p = (pointer)paVar9;
  }
  else {
    local_130.field_2._M_allocated_capacity = pAVar13->size;
    local_130._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_130._M_string_length = plVar6[1];
  *plVar6 = (long)pAVar13;
  plVar6[1] = 0;
  *(undefined1 *)&pAVar13->size = 0;
  begin_code("parallel_for",local_130._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != paVar9) {
    operator_delete(local_130._M_dataplus._M_p,(ulong)(local_130.field_2._M_allocated_capacity + 1))
    ;
  }
  if (local_68 != (Alloc *)&local_58) {
    operator_delete(local_68,local_58 + 1);
  }
  if (local_d8 != &local_c8) {
    operator_delete(local_d8,local_c8 + 1);
  }
  if (local_f8 != local_e8) {
    operator_delete(local_f8,(ulong)((long)&local_e8[0]->size + 1));
  }
  pvVar3 = pvStack_70;
  iVar11 = (int)(uVar12 >> 2);
  if (0 < iVar11) {
    local_130._M_dataplus._M_p = (pointer)local_a0;
    if (((ulong)local_a0 & 7) == 0 && (Alloc *)local_a0 != (Alloc *)0x0) {
      local_130._M_dataplus._M_p = (pointer)(local_a0->_M_allocated_capacity * 8 + 1);
    }
    local_130._M_string_length = (size_type)local_98;
    local_130.field_2._M_allocated_capacity = (size_type)local_90;
    if (((ulong)local_90 & 7) == 0 && local_90 != (Alloc *)0x0) {
      local_130.field_2._M_allocated_capacity = local_90->size * 8 + 1;
    }
    local_130.field_2._8_8_ = pvStack_88;
    local_110 = local_80;
    local_108 = local_78;
    local_100 = pvStack_70;
    if (((ulong)local_78 & 7) == 0 && local_78 != (Alloc *)0x0) {
      local_78->use_count = local_78->use_count + -1;
      local_108 = (Alloc *)(local_78->size * 8 + 1);
    }
    local_78 = (Alloc *)0x0;
    pvStack_70 = (void *)0x0;
    entering_parallel = '\0';
    lVar8 = 0;
    do {
      *(bool *)((long)pvVar3 + lVar8) = local_80 == (*(byte *)((long)pvStack_88 + lVar8) & 3);
      lVar8 = lVar8 + 1;
    } while (iVar11 != (int)lVar8);
    filter_parents(Omega_h::Parents,int)::$_0::~__0((__0 *)&local_130);
  }
  ScopedTimer::~ScopedTimer(&local_131);
  uVar5 = local_48._16_8_;
  local_48._0_8_ = local_b8.shared_alloc_.alloc;
  local_48._8_8_ = local_b8.shared_alloc_.direct_ptr;
  if ((((ulong)local_b8.shared_alloc_.alloc & 7) == 0 &&
       local_b8.shared_alloc_.alloc != (Alloc *)0x0) && (entering_parallel == '\x01')) {
    (local_b8.shared_alloc_.alloc)->use_count = (local_b8.shared_alloc_.alloc)->use_count + -1;
    local_48._0_8_ = (local_b8.shared_alloc_.alloc)->size * 8 + 1;
  }
  local_b8.shared_alloc_.alloc = (Alloc *)0x0;
  local_b8.shared_alloc_.direct_ptr = (void *)0x0;
  Read<signed_char>::Read((Read<signed_char> *)local_48._16_8_,(Write<signed_char> *)local_48);
  uVar4 = local_48._0_8_;
  if ((local_48._0_8_ & 7) == 0 && (Alloc *)local_48._0_8_ != (Alloc *)0x0) {
    piVar2 = (int *)(local_48._0_8_ + 0x30);
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc((Alloc *)local_48._0_8_);
      operator_delete((void *)uVar4,0x48);
    }
  }
  filter_parents(Omega_h::Parents,int)::$_0::~__0((__0 *)&local_a0);
  pAVar13 = local_b8.shared_alloc_.alloc;
  if (((ulong)local_b8.shared_alloc_.alloc & 7) == 0 && local_b8.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    piVar2 = &(local_b8.shared_alloc_.alloc)->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(local_b8.shared_alloc_.alloc);
      operator_delete(pAVar13,0x48);
    }
  }
  ScopedTimer::~ScopedTimer(&local_132);
  BVar16.write_.shared_alloc_.direct_ptr = extraout_RDX;
  BVar16.write_.shared_alloc_.alloc = (Alloc *)uVar5;
  return (Bytes)BVar16.write_.shared_alloc_;
}

Assistant:

Bytes filter_parents(Parents const c2p, Int const parent_dim) {
  OMEGA_H_TIME_FUNCTION;
  Write<Byte> filter(c2p.parent_idx.size());
  auto f = OMEGA_H_LAMBDA(LO c) {
    auto const code = c2p.codes[c];
    if (amr::code_parent_dim(code) == parent_dim)
      filter[c] = 1;
    else
      filter[c] = 0;
  };
  parallel_for(c2p.parent_idx.size(), std::move(f));
  return filter;
}